

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-stdio-over-pipes.c
# Opt level: O2

void after_write(uv_write_t *req,int status)

{
  FILE *__stream;
  undefined8 uVar1;
  
  __stream = _stderr;
  if (status == 0) {
    free(req);
    after_write_cb_called = after_write_cb_called + 1;
    return;
  }
  uVar1 = uv_strerror(status);
  fprintf(__stream,"uv_write error: %s\n",uVar1);
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-stdio-over-pipes.c"
          ,0x57,"0");
  abort();
}

Assistant:

static void after_write(uv_write_t* req, int status) {
  if (status) {
    fprintf(stderr, "uv_write error: %s\n", uv_strerror(status));
    ASSERT(0);
  }

  /* Free the read/write buffer and the request */
  free(req);

  after_write_cb_called++;
}